

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O3

int NeedEQU(void)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  
  pcVar2 = lp;
  cVar1 = *lp;
  while ((byte)(cVar1 - 1U) < 0x20) {
    lp = lp + 1;
    cVar1 = *lp;
  }
  if (cVar1 == '.') {
    lp = lp + 1;
  }
  iVar3 = cmphstr(&lp,"equ",false);
  if (iVar3 == 0) {
    lp = pcVar2;
  }
  return (uint)(iVar3 != 0);
}

Assistant:

int NeedEQU() {
	char* olp = lp;
	SkipBlanks();
	/*if (*lp=='=') { ++lp; return 1; }*/
	/* cut: if (*lp=='=') { ++lp; return 1; } */
	if (*lp == '.') {
		++lp;
	}
	if (cmphstr(lp, "equ")) {
		return 1;
	}
	lp = olp;
	return 0;
}